

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Int_t * Gia_SimRsbTfo(Gia_SimRsbMan_t *p,int iObj,int iFanout)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__base;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1b3,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
  }
  p->vTfo->nSize = 0;
  Gia_ManIncrementTravId(p->pGia);
  Gia_SimRsbTfo_rec(p->pGia,iObj,iFanout,p->vTfo);
  pVVar2 = p->vTfo;
  iVar3 = pVVar2->nSize;
  if (0 < (long)iVar3) {
    __base = pVVar2->pArray;
    if (__base[(long)iVar3 + -1] == iObj) {
      iVar5 = iVar3 + -1;
      pVVar2->nSize = iVar5;
      if (2 < iVar3) {
        iVar3 = -1;
        lVar4 = 0;
        do {
          iVar1 = __base[lVar4];
          __base[lVar4] = __base[iVar5 + iVar3];
          __base[pVVar2->nSize + iVar3] = iVar1;
          lVar4 = lVar4 + 1;
          iVar5 = pVVar2->nSize;
          iVar3 = iVar3 + -1;
        } while (lVar4 < iVar5 / 2);
      }
      qsort(__base,(long)pVVar2->nSize,4,Vec_IntSortCompare1);
      return p->vTfo;
    }
    __assert_fail("Vec_IntEntryLast(p->vTfo) == iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1b7,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_SimRsbTfo( Gia_SimRsbMan_t * p, int iObj, int iFanout )
{
    assert( iObj > 0 );
    Vec_IntClear( p->vTfo );
    Gia_ManIncrementTravId( p->pGia );
    Gia_SimRsbTfo_rec( p->pGia, iObj, iFanout, p->vTfo );
    assert( Vec_IntEntryLast(p->vTfo) == iObj );
    Vec_IntPop( p->vTfo );
    Vec_IntReverseOrder( p->vTfo );
    Vec_IntSort( p->vTfo, 0 );
    return p->vTfo;
}